

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcborstreamreader.cpp
# Opt level: O3

void __thiscall QCborStreamReader::reparse(QCborStreamReader *this)

{
  QCborStreamReader QVar1;
  byte bVar2;
  uint uVar3;
  QCborStreamReaderPrivate *this_00;
  long lVar4;
  long lVar5;
  CborError CVar6;
  undefined8 *puVar7;
  ulong uVar8;
  long *plVar9;
  
  this_00 = *(QCborStreamReaderPrivate **)(this + 8);
  (this_00->lastError).c = NoError;
  QCborStreamReaderPrivate::preread(this_00);
  plVar9 = *(long **)(this + 8);
  if ((*(byte *)((long)plVar9 + 0x5f) & 8) == 0) {
    CVar6 = preparse_next_value_nodecrement((CborValue *)(plVar9 + 9));
    plVar9 = *(long **)(this + 8);
    if (CVar6 != CborNoError) {
      if (CVar6 != CborErrorUnexpectedEOF) {
        *(undefined1 *)(plVar9 + 0xe) = 1;
      }
      *(CborError *)(plVar9 + 0xc) = CVar6;
      return;
    }
  }
  if ((int)plVar9[0xc] == 0) {
    QVar1 = *(QCborStreamReader *)((long)plVar9 + 0x5e);
    this[0x10] = QVar1;
    if (QVar1 == (QCborStreamReader)0xff) {
      if ((*plVar9 != 0) && (plVar9[6] == 0)) {
        QByteArray::clear((QByteArray *)(plVar9 + 1));
        puVar7 = *(undefined8 **)(this + 8);
        if (puVar7[0xd] != 0) {
          QIODevice::skip((QIODevice *)*puVar7,puVar7[0xd]);
          puVar7 = *(undefined8 **)(this + 8);
        }
        puVar7[0xd] = 0;
      }
    }
    else {
      *(undefined4 *)(plVar9 + 0xc) = 0;
      if ((byte)((char)QVar1 + 0xbU) < 3) {
        this[0x10] = (QCborStreamReader)0xe0;
        *(ulong *)this = (ulong)*(byte *)(plVar9[2] + plVar9[0xd]) - 0xe0;
      }
      else {
        bVar2 = *(byte *)((long)plVar9 + 0x5f);
        if ((bVar2 & 2) == 0) {
          uVar8 = (ulong)*(ushort *)((long)plVar9 + 0x5c);
        }
        else {
          lVar4 = *(long *)(plVar9[10] + 0x10);
          lVar5 = *(long *)(plVar9[10] + 0x68);
          if ((bVar2 & 1) == 0) {
            uVar3 = *(uint *)(lVar4 + 1 + lVar5);
            uVar8 = (ulong)(uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 |
                           uVar3 << 0x18);
          }
          else {
            uVar8 = *(ulong *)(lVar4 + 1 + lVar5);
            uVar8 = uVar8 >> 0x38 | (uVar8 & 0xff000000000000) >> 0x28 |
                    (uVar8 & 0xff0000000000) >> 0x18 | (uVar8 & 0xff00000000) >> 8 |
                    (uVar8 & 0xff000000) << 8 | (uVar8 & 0xff0000) << 0x18 |
                    (uVar8 & 0xff00) << 0x28 | uVar8 << 0x38;
          }
        }
        *(ulong *)this = uVar8;
        if ((bVar2 & 4) != 0 && QVar1 == (QCborStreamReader)0x0) {
          this[0x10] = (QCborStreamReader)0x20;
        }
      }
    }
  }
  else {
    this[0x10] = (QCborStreamReader)0xff;
  }
  return;
}

Assistant:

void QCborStreamReader::reparse()
{
    d->lastError = {};
    d->preread();
    if (CborError err = cbor_value_reparse(&d->currentElement))
        d->handleError(err);
    else
        preparse();
}